

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall
ON_SubDMeshFragment::CopyFrom
          (ON_SubDMeshFragment *this,ON_SubDMeshFragment *src_fragment,uint display_density)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ON_3dVector quad_normal_00;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  double *pdVar10;
  ON_SurfaceCurvature *pOVar11;
  ON_Color *pOVar12;
  ON_Color *c1_1;
  ON_Color *c_3;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paStack_228;
  uint i_4;
  ON_Color *src_c_1;
  uint j_4;
  size_t c_stride_1;
  ON_Color *c_2;
  ON_SurfaceCurvature *k1_1;
  ON_SurfaceCurvature *k_3;
  ON_SurfaceCurvature *pOStack_1f0;
  uint i_3;
  ON_SurfaceCurvature *src_k_1;
  uint j_3;
  size_t k_stride_1;
  ON_SurfaceCurvature *k_2;
  uint i_2;
  uint j_2;
  uint i_1;
  uint j_1;
  uint i;
  uint j;
  size_t j_stride;
  size_t i_stride;
  uint dj;
  uint di;
  uint m;
  uint x;
  uint s1;
  uint s0;
  ON_Color *c1;
  ON_Color *c_1;
  ON_Color *src_c1;
  size_t src_c_stride;
  ON_Color *src_c;
  size_t c_stride;
  ON_Color *c;
  ON_SurfaceCurvature *k1;
  ON_SurfaceCurvature *k_1;
  ON_SurfaceCurvature *src_k1;
  size_t src_k_stride;
  ON_SurfaceCurvature *src_k;
  size_t k_stride;
  ON_SurfaceCurvature *k;
  double *src_p1;
  size_t src_p_stride;
  double *src_p;
  size_t p_stride;
  double *p;
  undefined1 local_f0 [4];
  uint V_count;
  ON_SubDMeshFragmentGrid grid;
  uint src_V_count;
  undefined1 local_a0 [8];
  ON_3dVector quad_normal;
  ON_3dPoint quad_points [4];
  uint display_density_local;
  ON_SubDMeshFragment *src_fragment_local;
  ON_SubDMeshFragment *this_local;
  
  if (this == src_fragment) {
    this_local._7_1_ = true;
  }
  else {
    Clear(this);
    this->m_face = src_fragment->m_face;
    this->m_face_vertex_index[0] = src_fragment->m_face_vertex_index[0];
    this->m_face_vertex_index[1] = src_fragment->m_face_vertex_index[1];
    this->m_face_vertex_index[2] = src_fragment->m_face_vertex_index[2];
    this->m_face_vertex_index[3] = src_fragment->m_face_vertex_index[3];
    this->m_face_fragment_count = src_fragment->m_face_fragment_count;
    this->m_face_fragment_index = src_fragment->m_face_fragment_index;
    bVar4 = GetControlNetQuad(src_fragment,false,(ON_3dPoint *)&quad_normal.z,
                              (ON_3dVector *)local_a0);
    if (bVar4) {
      quad_normal_00.y = quad_normal.x;
      quad_normal_00.x = (double)local_a0;
      quad_normal_00.z = quad_normal.y;
      SetControlNetQuad(this,false,(ON_3dPoint *)&quad_normal.z,quad_normal_00);
    }
    bVar4 = TextureCoordinatesExistForExperts(src_fragment);
    if (bVar4) {
      this->m_ctrlnetT[0][0] = src_fragment->m_ctrlnetT[0][0];
      this->m_ctrlnetT[0][1] = src_fragment->m_ctrlnetT[0][1];
      this->m_ctrlnetT[0][2] = src_fragment->m_ctrlnetT[0][2];
      this->m_ctrlnetT[1][0] = src_fragment->m_ctrlnetT[1][0];
      this->m_ctrlnetT[1][1] = src_fragment->m_ctrlnetT[1][1];
      this->m_ctrlnetT[1][2] = src_fragment->m_ctrlnetT[1][2];
      this->m_ctrlnetT[2][0] = src_fragment->m_ctrlnetT[2][0];
      this->m_ctrlnetT[2][1] = src_fragment->m_ctrlnetT[2][1];
      this->m_ctrlnetT[2][2] = src_fragment->m_ctrlnetT[2][2];
      this->m_ctrlnetT[3][0] = src_fragment->m_ctrlnetT[3][0];
      this->m_ctrlnetT[3][1] = src_fragment->m_ctrlnetT[3][1];
      this->m_ctrlnetT[3][2] = src_fragment->m_ctrlnetT[3][2];
    }
    bVar4 = CurvaturesExistForExperts(src_fragment);
    if (bVar4) {
      this->m_ctrlnetK[0].k1 = src_fragment->m_ctrlnetK[0].k1;
      this->m_ctrlnetK[0].k2 = src_fragment->m_ctrlnetK[0].k2;
      this->m_ctrlnetK[1].k1 = src_fragment->m_ctrlnetK[1].k1;
      this->m_ctrlnetK[1].k2 = src_fragment->m_ctrlnetK[1].k2;
      this->m_ctrlnetK[2].k1 = src_fragment->m_ctrlnetK[2].k1;
      this->m_ctrlnetK[2].k2 = src_fragment->m_ctrlnetK[2].k2;
      this->m_ctrlnetK[3].k1 = src_fragment->m_ctrlnetK[3].k1;
      this->m_ctrlnetK[3].k2 = src_fragment->m_ctrlnetK[3].k2;
    }
    bVar4 = ColorsExistForExperts(src_fragment);
    if (bVar4) {
      this->m_ctrlnetC[0].field_0 = src_fragment->m_ctrlnetC[0].field_0;
      this->m_ctrlnetC[1].field_0 = src_fragment->m_ctrlnetC[1].field_0;
      this->m_ctrlnetC[2].field_0 = src_fragment->m_ctrlnetC[2].field_0;
      this->m_ctrlnetC[3].field_0 = src_fragment->m_ctrlnetC[3].field_0;
    }
    this->m_pack_rect[0][0] = src_fragment->m_pack_rect[0][0];
    this->m_pack_rect[0][1] = src_fragment->m_pack_rect[0][1];
    this->m_pack_rect[1][0] = src_fragment->m_pack_rect[1][0];
    this->m_pack_rect[1][1] = src_fragment->m_pack_rect[1][1];
    this->m_pack_rect[2][0] = src_fragment->m_pack_rect[2][0];
    this->m_pack_rect[2][1] = src_fragment->m_pack_rect[2][1];
    this->m_pack_rect[3][0] = src_fragment->m_pack_rect[3][0];
    this->m_pack_rect[3][1] = src_fragment->m_pack_rect[3][1];
    if ((display_density < 7) || (display_density == 0xffffffff)) {
      uVar5 = VertexCount(src_fragment);
      grid.m_next_level_of_detail._4_4_ = uVar5;
      if ((uVar5 == 0) ||
         (uVar6 = ON_SubDMeshFragmentGrid::GridPointCount(&src_fragment->m_grid),
         uVar7 = grid.m_next_level_of_detail._4_4_, uVar5 != uVar6)) {
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
      }
      else {
        uVar5 = PointCount(src_fragment);
        if (uVar7 == uVar5) {
          if (display_density == 0xffffffff) {
            memcpy(local_f0,&src_fragment->m_grid,0x30);
          }
          else {
            ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity
                      ((ON_SubDMeshFragmentGrid *)local_f0,display_density,0);
          }
          uVar5 = ON_SubDMeshFragmentGrid::GridPointCount((ON_SubDMeshFragmentGrid *)local_f0);
          uVar7 = VertexCapacity(this);
          if ((uVar5 <= uVar7) || (bVar4 = ReserveManagedVertexCapacity(this,(ulong)uVar5), bVar4))
          {
            uVar7 = VertexCapacity(this);
            if ((uVar7 < uVar5) || (uVar7 = VertexCount(src_fragment), uVar7 < uVar5)) {
              ON_SubDIncrementErrorCount();
              this_local._7_1_ = false;
            }
            else {
              memcpy(&this->m_grid,local_f0,0x30);
              p_stride = (size_t)this->m_P;
              sVar1 = this->m_P_stride;
              src_p_stride = (size_t)src_fragment->m_P;
              sVar2 = src_fragment->m_P_stride;
              pdVar10 = (double *)(src_p_stride + sVar2 * grid.m_next_level_of_detail._4_4_ * 8);
              if (uVar5 == grid.m_next_level_of_detail._4_4_) {
                uVar7 = PointCapacity(this);
                if (uVar5 <= uVar7) {
                  for (; src_p_stride < pdVar10; src_p_stride = sVar2 * 8 + src_p_stride) {
                    *(undefined8 *)p_stride = *(undefined8 *)src_p_stride;
                    *(undefined8 *)(p_stride + 8) = *(undefined8 *)(src_p_stride + 8);
                    *(undefined8 *)(p_stride + 0x10) = *(undefined8 *)(src_p_stride + 0x10);
                    p_stride = sVar1 * 8 + p_stride;
                  }
                  memcpy(&this->m_surface_bbox,&src_fragment->m_surface_bbox,0x30);
                }
                uVar7 = NormalCapacity(this);
                if (uVar5 <= uVar7) {
                  uVar7 = NormalCount(src_fragment);
                  if (uVar5 == uVar7) {
                    p_stride = (size_t)this->m_N;
                    sVar1 = this->m_N_stride;
                    src_p_stride = (size_t)src_fragment->m_N;
                    sVar2 = src_fragment->m_N_stride;
                    pdVar10 = (double *)
                              (src_p_stride + sVar2 * grid.m_next_level_of_detail._4_4_ * 8);
                    for (; src_p_stride < pdVar10; src_p_stride = sVar2 * 8 + src_p_stride) {
                      *(undefined8 *)p_stride = *(undefined8 *)src_p_stride;
                      *(undefined8 *)(p_stride + 8) = *(undefined8 *)(src_p_stride + 8);
                      *(undefined8 *)(p_stride + 0x10) = *(undefined8 *)(src_p_stride + 0x10);
                      p_stride = sVar1 * 8 + p_stride;
                    }
                  }
                  else {
                    Internal_Set3dPointArrayToNan(this->m_N,(ulong)uVar5,this->m_N_stride);
                  }
                }
                uVar7 = TextureCoordinateCapacity(this);
                if (uVar5 <= uVar7) {
                  uVar7 = TextureCoordinateCount(src_fragment);
                  if (uVar5 == uVar7) {
                    SetTextureCoordinatesExistForExperts(this,true);
                    p_stride = (size_t)this->m_T;
                    sVar1 = this->m_T_stride;
                    src_p_stride = (size_t)src_fragment->m_T;
                    sVar2 = src_fragment->m_T_stride;
                    pdVar10 = (double *)
                              (src_p_stride + sVar2 * grid.m_next_level_of_detail._4_4_ * 8);
                    for (; src_p_stride < pdVar10; src_p_stride = sVar2 * 8 + src_p_stride) {
                      *(undefined8 *)p_stride = *(undefined8 *)src_p_stride;
                      *(undefined8 *)(p_stride + 8) = *(undefined8 *)(src_p_stride + 8);
                      *(undefined8 *)(p_stride + 0x10) = *(undefined8 *)(src_p_stride + 0x10);
                      p_stride = sVar1 * 8 + p_stride;
                    }
                  }
                  else {
                    Internal_Set3dPointArrayToNan(this->m_T,(ulong)uVar5,this->m_T_stride);
                  }
                }
                uVar7 = CurvatureCapacity(this);
                if (uVar5 <= uVar7) {
                  uVar7 = CurvatureCount(src_fragment);
                  if (uVar5 == uVar7) {
                    SetCurvaturesExistForExperts(this,true);
                    k_stride = (size_t)this->m_K;
                    sVar1 = this->m_K_stride;
                    src_k_stride = (size_t)src_fragment->m_K;
                    sVar2 = src_fragment->m_K_stride;
                    pOVar11 = (ON_SurfaceCurvature *)
                              (src_k_stride + sVar2 * grid.m_next_level_of_detail._4_4_ * 0x10);
                    for (; src_k_stride < pOVar11; src_k_stride = sVar2 * 0x10 + src_k_stride) {
                      *(undefined8 *)k_stride = *(undefined8 *)src_k_stride;
                      *(undefined8 *)(k_stride + 8) = *(undefined8 *)(src_k_stride + 8);
                      k_stride = sVar1 * 0x10 + k_stride;
                    }
                  }
                  else {
                    k1 = this->m_K;
                    pOVar11 = k1 + (ulong)uVar5 * this->m_K_stride;
                    for (; k1 < pOVar11; k1 = k1 + this->m_K_stride) {
                      k1->k1 = ON_SurfaceCurvature::Nan.k1;
                      k1->k2 = ON_SurfaceCurvature::Nan.k2;
                    }
                  }
                }
                uVar7 = ColorCapacity(this);
                if (uVar5 <= uVar7) {
                  uVar7 = ColorCount(src_fragment);
                  if (uVar5 == uVar7) {
                    SetColorsExistForExperts(this,true);
                    c_stride = (size_t)this->m_C;
                    sVar1 = this->m_C_stride;
                    src_c_stride = (size_t)src_fragment->m_C;
                    sVar2 = src_fragment->m_C_stride;
                    pOVar12 = (ON_Color *)
                              (src_c_stride + sVar2 * grid.m_next_level_of_detail._4_4_ * 4);
                    for (; src_c_stride < pOVar12; src_c_stride = sVar2 * 4 + src_c_stride) {
                      *(undefined4 *)c_stride = *(undefined4 *)src_c_stride;
                      c_stride = sVar1 * 4 + c_stride;
                    }
                  }
                  else {
                    c1 = this->m_C;
                    pOVar12 = c1 + (ulong)uVar5 * this->m_C_stride;
                    for (; c1 < pOVar12; c1 = c1 + this->m_C_stride) {
                      c1->field_0 = (anon_union_4_2_6147a14e_for_ON_Color_15)ON_Color::UnsetColor;
                    }
                  }
                }
              }
              else {
                uVar7 = ON_SubDMeshFragmentGrid::SideSegmentCount
                                  ((ON_SubDMeshFragmentGrid *)local_f0);
                uVar6 = ON_SubDMeshFragmentGrid::SideSegmentCount(&src_fragment->m_grid);
                for (di = 1; di * uVar7 < uVar6; di = di << 1) {
                }
                uVar7 = ON_SubDMeshFragmentGrid::SidePointCount(&src_fragment->m_grid);
                uVar6 = ON_SubDMeshFragmentGrid::PointIndexFromGrid2dex(&src_fragment->m_grid,di,0);
                uVar8 = ON_SubDMeshFragmentGrid::PointIndexFromGrid2dex(&src_fragment->m_grid,0,di);
                sVar2 = src_fragment->m_P_stride;
                sVar3 = src_fragment->m_P_stride;
                uVar9 = PointCapacity(this);
                if (uVar5 <= uVar9) {
                  for (j_1 = 0; j_1 < uVar7; j_1 = uVar8 + j_1) {
                    src_p_stride = (size_t)(src_fragment->m_P + (ulong)j_1 * (uVar7 * uVar8) * sVar3
                                           );
                    for (i_1 = 0; i_1 < uVar7; i_1 = uVar6 + i_1) {
                      *(undefined8 *)p_stride = *(undefined8 *)src_p_stride;
                      *(undefined8 *)(p_stride + 8) = *(undefined8 *)(src_p_stride + 8);
                      *(undefined8 *)(p_stride + 0x10) = *(undefined8 *)(src_p_stride + 0x10);
                      p_stride = sVar1 * 8 + p_stride;
                      src_p_stride = uVar6 * sVar2 * 8 + src_p_stride;
                    }
                  }
                  memcpy(&this->m_surface_bbox,&src_fragment->m_surface_bbox,0x30);
                }
                uVar9 = NormalCapacity(this);
                if (uVar5 <= uVar9) {
                  uVar9 = NormalCount(src_fragment);
                  if (uVar9 < uVar5) {
                    Internal_Set3dPointArrayToNan(this->m_N,(ulong)uVar5,this->m_N_stride);
                  }
                  else {
                    p_stride = (size_t)this->m_N;
                    sVar1 = this->m_N_stride;
                    sVar2 = src_fragment->m_N_stride;
                    sVar3 = src_fragment->m_N_stride;
                    for (j_2 = 0; j_2 < uVar7; j_2 = uVar8 + j_2) {
                      src_p_stride = (size_t)(src_fragment->m_N +
                                             (ulong)j_2 * (uVar7 * uVar8) * sVar3);
                      for (i_2 = 0; i_2 < uVar7; i_2 = uVar6 + i_2) {
                        *(undefined8 *)p_stride = *(undefined8 *)src_p_stride;
                        *(undefined8 *)(p_stride + 8) = *(undefined8 *)(src_p_stride + 8);
                        *(undefined8 *)(p_stride + 0x10) = *(undefined8 *)(src_p_stride + 0x10);
                        p_stride = sVar1 * 8 + p_stride;
                        src_p_stride = uVar6 * sVar2 * 8 + src_p_stride;
                      }
                    }
                  }
                }
                uVar9 = TextureCoordinateCapacity(this);
                if (uVar5 <= uVar9) {
                  uVar9 = TextureCoordinateCount(src_fragment);
                  if (uVar9 < uVar5) {
                    Internal_Set3dPointArrayToNan(this->m_T,(ulong)uVar5,this->m_T_stride);
                  }
                  else {
                    SetTextureCoordinatesExistForExperts(this,true);
                    p_stride = (size_t)this->m_T;
                    sVar1 = this->m_T_stride;
                    sVar2 = src_fragment->m_T_stride;
                    sVar3 = src_fragment->m_T_stride;
                    for (k_2._4_4_ = 0; k_2._4_4_ < uVar7; k_2._4_4_ = uVar8 + k_2._4_4_) {
                      src_p_stride = (size_t)(src_fragment->m_T +
                                             (ulong)k_2._4_4_ * (uVar7 * uVar8) * sVar3);
                      for (k_2._0_4_ = 0; (uint)k_2 < uVar7; k_2._0_4_ = uVar6 + (uint)k_2) {
                        *(undefined8 *)p_stride = *(undefined8 *)src_p_stride;
                        *(undefined8 *)(p_stride + 8) = *(undefined8 *)(src_p_stride + 8);
                        *(undefined8 *)(p_stride + 0x10) = *(undefined8 *)(src_p_stride + 0x10);
                        p_stride = sVar1 * 8 + p_stride;
                        src_p_stride = uVar6 * sVar2 * 8 + src_p_stride;
                      }
                    }
                  }
                }
                uVar9 = CurvatureCapacity(this);
                if (uVar5 <= uVar9) {
                  uVar9 = CurvatureCount(src_fragment);
                  if (uVar9 < uVar5) {
                    k1_1 = this->m_K;
                    pOVar11 = k1_1 + (ulong)uVar5 * this->m_K_stride;
                    for (; k1_1 < pOVar11; k1_1 = k1_1 + this->m_K_stride) {
                      k1_1->k1 = ON_SurfaceCurvature::Nan.k1;
                      k1_1->k2 = ON_SurfaceCurvature::Nan.k2;
                    }
                  }
                  else {
                    SetCurvaturesExistForExperts(this,true);
                    k_stride_1 = (size_t)this->m_K;
                    sVar1 = this->m_K_stride;
                    sVar2 = src_fragment->m_K_stride;
                    sVar3 = src_fragment->m_K_stride;
                    for (src_k_1._4_4_ = 0; src_k_1._4_4_ < uVar7;
                        src_k_1._4_4_ = uVar8 + src_k_1._4_4_) {
                      pOStack_1f0 = src_fragment->m_K +
                                    (ulong)src_k_1._4_4_ * (uVar7 * uVar8) * sVar3;
                      for (k_3._4_4_ = 0; k_3._4_4_ < uVar7; k_3._4_4_ = uVar6 + k_3._4_4_) {
                        *(double *)k_stride_1 = pOStack_1f0->k1;
                        *(double *)(k_stride_1 + 8) = pOStack_1f0->k2;
                        k_stride_1 = sVar1 * 0x10 + k_stride_1;
                        pOStack_1f0 = pOStack_1f0 + uVar6 * sVar2;
                      }
                    }
                  }
                }
                uVar9 = ColorCapacity(this);
                if (uVar5 <= uVar9) {
                  uVar9 = ColorCount(src_fragment);
                  if (uVar9 < uVar5) {
                    c1_1 = this->m_C;
                    pOVar12 = c1_1 + (ulong)uVar5 * this->m_C_stride;
                    for (; c1_1 < pOVar12; c1_1 = c1_1 + this->m_C_stride) {
                      c1_1->field_0 = (anon_union_4_2_6147a14e_for_ON_Color_15)ON_Color::UnsetColor;
                    }
                  }
                  else {
                    SetColorsExistForExperts(this,true);
                    c_stride_1 = (size_t)this->m_C;
                    sVar1 = this->m_C_stride;
                    sVar2 = src_fragment->m_C_stride;
                    sVar3 = src_fragment->m_C_stride;
                    for (src_c_1._4_4_ = 0; src_c_1._4_4_ < uVar7;
                        src_c_1._4_4_ = uVar8 + src_c_1._4_4_) {
                      paStack_228 = &src_fragment->m_C
                                     [(ulong)src_c_1._4_4_ * (uVar7 * uVar8) * sVar3].field_0;
                      for (c_3._4_4_ = 0; c_3._4_4_ < uVar7; c_3._4_4_ = uVar6 + c_3._4_4_) {
                        *(anon_union_4_2_6147a14e_for_ON_Color_15 *)c_stride_1 = *paStack_228;
                        c_stride_1 = sVar1 * 4 + c_stride_1;
                        paStack_228 = paStack_228 + uVar6 * sVar2;
                      }
                    }
                  }
                }
              }
              SetVertexCount(this,(ulong)uVar5);
              this_local._7_1_ = true;
            }
          }
          else {
            ON_SubDIncrementErrorCount();
            this_local._7_1_ = false;
          }
        }
        else {
          ON_SubDIncrementErrorCount();
          this_local._7_1_ = false;
        }
      }
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDMeshFragment::CopyFrom(
  const ON_SubDMeshFragment& src_fragment,
  unsigned int display_density
  )
{
  if (this == &src_fragment)
  {
    return true;
  }

  this->Clear();

  m_face = src_fragment.m_face;
  m_face_vertex_index[0] = src_fragment.m_face_vertex_index[0];
  m_face_vertex_index[1] = src_fragment.m_face_vertex_index[1];
  m_face_vertex_index[2] = src_fragment.m_face_vertex_index[2];
  m_face_vertex_index[3] = src_fragment.m_face_vertex_index[3];
  m_face_fragment_count = src_fragment.m_face_fragment_count;
  m_face_fragment_index = src_fragment.m_face_fragment_index;


  ON_3dPoint quad_points[4];
  ON_3dVector quad_normal;
  if (src_fragment.GetControlNetQuad(false, quad_points, quad_normal))
    this->SetControlNetQuad(false, quad_points, quad_normal);

  if (src_fragment.TextureCoordinatesExistForExperts())
  {
    m_ctrlnetT[0][0] = src_fragment.m_ctrlnetT[0][0];
    m_ctrlnetT[0][1] = src_fragment.m_ctrlnetT[0][1];
    m_ctrlnetT[0][2] = src_fragment.m_ctrlnetT[0][2];
    m_ctrlnetT[1][0] = src_fragment.m_ctrlnetT[1][0];
    m_ctrlnetT[1][1] = src_fragment.m_ctrlnetT[1][1];
    m_ctrlnetT[1][2] = src_fragment.m_ctrlnetT[1][2];
    m_ctrlnetT[2][0] = src_fragment.m_ctrlnetT[2][0];
    m_ctrlnetT[2][1] = src_fragment.m_ctrlnetT[2][1];
    m_ctrlnetT[2][2] = src_fragment.m_ctrlnetT[2][2];
    m_ctrlnetT[3][0] = src_fragment.m_ctrlnetT[3][0];
    m_ctrlnetT[3][1] = src_fragment.m_ctrlnetT[3][1];
    m_ctrlnetT[3][2] = src_fragment.m_ctrlnetT[3][2];
  }

  if (src_fragment.CurvaturesExistForExperts())
  {
    m_ctrlnetK[0] = src_fragment.m_ctrlnetK[0];
    m_ctrlnetK[1] = src_fragment.m_ctrlnetK[1];
    m_ctrlnetK[2] = src_fragment.m_ctrlnetK[2];
    m_ctrlnetK[3] = src_fragment.m_ctrlnetK[3];
  }

  if (src_fragment.ColorsExistForExperts())
  {
    m_ctrlnetC[0] = src_fragment.m_ctrlnetC[0];
    m_ctrlnetC[1] = src_fragment.m_ctrlnetC[1];
    m_ctrlnetC[2] = src_fragment.m_ctrlnetC[2];
    m_ctrlnetC[3] = src_fragment.m_ctrlnetC[3];
  }

  m_pack_rect[0][0] = src_fragment.m_pack_rect[0][0];
  m_pack_rect[0][1] = src_fragment.m_pack_rect[0][1];
  m_pack_rect[1][0] = src_fragment.m_pack_rect[1][0];
  m_pack_rect[1][1] = src_fragment.m_pack_rect[1][1];
  m_pack_rect[2][0] = src_fragment.m_pack_rect[2][0];
  m_pack_rect[2][1] = src_fragment.m_pack_rect[2][1];
  m_pack_rect[3][0] = src_fragment.m_pack_rect[3][0];
  m_pack_rect[3][1] = src_fragment.m_pack_rect[3][1];

  if ( display_density > ON_SubDDisplayParameters::MaximumDensity && ON_UNSET_UINT_INDEX != display_density)
    return ON_SUBD_RETURN_ERROR(false);

  const unsigned src_V_count = src_fragment.VertexCount();
  if ( 0 == src_V_count || src_V_count != src_fragment.m_grid.GridPointCount() )
    return ON_SUBD_RETURN_ERROR(false);

  if (src_V_count != src_fragment.PointCount())
    return ON_SUBD_RETURN_ERROR(false);

  const ON_SubDMeshFragmentGrid grid
    = (ON_UNSET_UINT_INDEX == display_density)
    ? src_fragment.m_grid
    : ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity(display_density,0);
  const unsigned V_count = grid.GridPointCount();
  if (VertexCapacity() < V_count)
  {
    if (false == this->ReserveManagedVertexCapacity(V_count))
      return ON_SUBD_RETURN_ERROR(false);
  }
  if (V_count > VertexCapacity() || V_count > src_fragment.VertexCount())
    return ON_SUBD_RETURN_ERROR(false);

  m_grid = grid;

  double* p = m_P;
  size_t p_stride = m_P_stride;
  const double* src_p = src_fragment.m_P;
  size_t src_p_stride = src_fragment.m_P_stride;
  const double* src_p1 = src_p + src_p_stride * src_V_count;
  if (V_count == src_V_count)
  {
    // Most common case where srf_fragment and target have the same density - faster way to copy.

    // copy m_P[]
    if (V_count <= this->PointCapacity())
    {
      while (src_p < src_p1)
      {
        p[0] = src_p[0];
        p[1] = src_p[1];
        p[2] = src_p[2];
        p += p_stride;
        src_p += src_p_stride;
      }
      m_surface_bbox = src_fragment.m_surface_bbox;
    }

    if (V_count <= this->NormalCapacity() )
    {
      if (V_count == src_fragment.NormalCount())
      {
        // copy m_N[]
        p = m_N;
        p_stride = m_N_stride;
        src_p = src_fragment.m_N;
        src_p_stride = src_fragment.m_N_stride;
        src_p1 = src_p + src_p_stride * src_V_count;
        while (src_p < src_p1)
        {
          p[0] = src_p[0];
          p[1] = src_p[1];
          p[2] = src_p[2];
          p += p_stride;
          src_p += src_p_stride;
        }
      }
      else
      {
        ON_SubDMeshFragment::Internal_Set3dPointArrayToNan(m_N, V_count, m_N_stride);
      }
    }

    if (V_count <= this->TextureCoordinateCapacity())
    {
      if (V_count == src_fragment.TextureCoordinateCount())
      {
        // copy m_T[]
        SetTextureCoordinatesExistForExperts(true);
        p = m_T;
        p_stride = m_T_stride;
        src_p = src_fragment.m_T;
        src_p_stride = src_fragment.m_T_stride;
        src_p1 = src_p + src_p_stride * src_V_count;
        while (src_p < src_p1)
        {
          p[0] = src_p[0];
          p[1] = src_p[1];
          p[2] = src_p[2];
          p += p_stride;
          src_p += src_p_stride;
        }
      }
      else
      {
        ON_SubDMeshFragment::Internal_Set3dPointArrayToNan(m_T, V_count, m_T_stride);
      }
    }

    if (V_count <= this->CurvatureCapacity())
    {
      if (V_count == src_fragment.CurvatureCount())
      {
        // copy m_K[]
        SetCurvaturesExistForExperts(true);
        ON_SurfaceCurvature* k = m_K;
        const size_t k_stride = m_K_stride;
        ON_SurfaceCurvature* src_k = src_fragment.m_K;
        size_t src_k_stride = src_fragment.m_K_stride;
        ON_SurfaceCurvature* src_k1 = src_k + src_k_stride * src_V_count;
        while (src_k < src_k1)
        {
          *k = *src_k;
          k += k_stride;
          src_k += src_k_stride;
        }
      }
      else
      {
        ON_SurfaceCurvature* k = m_K;
        for (ON_SurfaceCurvature* k1 = k + V_count * m_K_stride; k < k1; k += m_K_stride)
          *k = ON_SurfaceCurvature::Nan;
      }
    }

    if (V_count <= ColorCapacity())
    {
      if (V_count == src_fragment.ColorCount())
      {
        // copy m_C[]
        SetColorsExistForExperts(true);
        ON_Color* c = m_C;
        const size_t c_stride = m_C_stride;
        ON_Color* src_c = src_fragment.m_C;
        size_t src_c_stride = src_fragment.m_C_stride;
        ON_Color* src_c1 = src_c + src_c_stride * src_V_count;
        while (src_c < src_c1)
        {
          *c = *src_c;
          c += c_stride;
          src_c += src_c_stride;
        }
      }
      else
      {
        ON_Color* c = m_C;
        for (ON_Color* c1 = c + V_count * m_C_stride; c < c1; c += m_C_stride)
          *c = ON_Color::UnsetColor;
      }
    }
  }
  else
  {
    // src_fragment is more dense than target. Copy a subset of the points.
    //
    // This code appears to be rarely used. It is not well tested.
    //
    const unsigned int s0 = grid.SideSegmentCount();
    const unsigned int s1 = src_fragment.m_grid.SideSegmentCount();
    unsigned int x = 1;
    while (x*s0 < s1)
      x *= 2;
    const unsigned int m = src_fragment.m_grid.SidePointCount();
    const unsigned int di = src_fragment.m_grid.PointIndexFromGrid2dex(x, 0);
    const unsigned int dj = src_fragment.m_grid.PointIndexFromGrid2dex(0, x);

    // copy from src_fragment.m_P[] to this->m_P[]
    size_t i_stride = di * src_fragment.m_P_stride;
    size_t j_stride = m * dj * src_fragment.m_P_stride;

    if (V_count <= this->PointCapacity())
    {
      for (unsigned int j = 0; j < m; j += dj)
      {
        src_p = src_fragment.m_P + j * j_stride;
        for (unsigned int i = 0; i < m; i += di)
        {
          p[0] = src_p[0];
          p[1] = src_p[1];
          p[2] = src_p[2];
          p += p_stride;
          src_p += i_stride;
        }
      }
      m_surface_bbox = src_fragment.m_surface_bbox;
    }

    if (V_count <= this->NormalCapacity())
    {
      // copy from src_fragment.m_N[] to this->m_N[]
      if (V_count <= src_fragment.NormalCount())
      {
        p = m_N;
        p_stride = m_N_stride;
        i_stride = di * src_fragment.m_N_stride;
        j_stride = m * dj * src_fragment.m_N_stride;
        for (unsigned int j = 0; j < m; j += dj)
        {
          src_p = src_fragment.m_N + j * j_stride;
          for (unsigned int i = 0; i < m; i += di)
          {
            p[0] = src_p[0];
            p[1] = src_p[1];
            p[2] = src_p[2];
            p += p_stride;
            src_p += i_stride;
          }
        }
      }
      else
      {
        ON_SubDMeshFragment::Internal_Set3dPointArrayToNan(m_N, V_count, m_N_stride);
      }
    }

    if (V_count <= this->TextureCoordinateCapacity())
    {
      // copy from src_fragment.m_T[] to this->m_T[]
      if (V_count <= src_fragment.TextureCoordinateCount())
      {
        SetTextureCoordinatesExistForExperts(true);
        p = m_T;
        p_stride = m_T_stride;
        i_stride = di * src_fragment.m_T_stride;
        j_stride = m * dj * src_fragment.m_T_stride;
        for (unsigned int j = 0; j < m; j += dj)
        {
          src_p = src_fragment.m_T + j * j_stride;
          for (unsigned int i = 0; i < m; i += di)
          {
            p[0] = src_p[0];
            p[1] = src_p[1];
            p[2] = src_p[2];
            p += p_stride;
            src_p += i_stride;
          }
        }
      }
      else
      {
        ON_SubDMeshFragment::Internal_Set3dPointArrayToNan(m_T, V_count, m_T_stride);
      }
    }

    if (V_count <= this->CurvatureCapacity())
    {
      // copy from src_fragment.m_K[] to this->m_K[]
      if (V_count <= src_fragment.CurvatureCount())
      {
        SetCurvaturesExistForExperts(true);
        ON_SurfaceCurvature* k = m_K;
        const size_t k_stride = m_K_stride;
        i_stride = di * src_fragment.m_K_stride;
        j_stride = m * dj * src_fragment.m_K_stride;
        for (unsigned int j = 0; j < m; j += dj)
        {
          const ON_SurfaceCurvature* src_k = src_fragment.m_K + j * j_stride;
          for (unsigned int i = 0; i < m; i += di)
          {
            *k = *src_k;
            k += k_stride;
            src_k += i_stride;
          }
        }
      }
      else
      {
        ON_SurfaceCurvature* k = m_K;
        for (ON_SurfaceCurvature* k1 = k + V_count * m_K_stride; k < k1; k += m_K_stride)
          *k = ON_SurfaceCurvature::Nan;
      }
    }

    if (V_count <= this->ColorCapacity())
    {
      // copy from src_fragment.m_C[] to this->m_C[]
      if (V_count <= src_fragment.ColorCount())
      {
        SetColorsExistForExperts(true);
        ON_Color*c = m_C;
        const size_t c_stride = m_C_stride;
        i_stride = di * src_fragment.m_C_stride;
        j_stride = m * dj * src_fragment.m_C_stride;
        for (unsigned int j = 0; j < m; j += dj)
        {
          const ON_Color* src_c = src_fragment.m_C + j * j_stride;
          for (unsigned int i = 0; i < m; i += di)
          {
            *c = *src_c;
            c += c_stride;
            src_c += i_stride;
          }
        }
      }
      else
      {
        ON_Color* c = m_C;
        for (ON_Color* c1 = c + V_count * m_C_stride; c < c1; c += m_C_stride)
          *c = ON_Color::UnsetColor;
      }
    }
  }

  SetVertexCount(V_count);

  return true;
}